

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O2

int Curl_cpool_check_limits(Curl_easy *data,connectdata *conn)

{
  Curl_multi *pCVar1;
  curl_off_t cVar2;
  curl_trc_feat *pcVar3;
  undefined8 uVar4;
  undefined4 uVar5;
  _Bool _Var6;
  cpool *cpool;
  cpool_bundle *list;
  size_t sVar7;
  Curl_llist_node *n;
  connectdata *pcVar8;
  timediff_t tVar9;
  connectdata *pcVar10;
  long lVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  bool bVar15;
  curltime cVar16;
  curltime newer;
  curltime older;
  size_t local_68;
  
  cpool = cpool_get_instance(data);
  if (cpool == (cpool *)0x0) {
    return 0;
  }
  pCVar1 = cpool->idata->multi;
  if (pCVar1 == (Curl_multi *)0x0) {
    uVar12 = 0;
    uVar14 = 0;
  }
  else {
    uVar12 = pCVar1->max_host_connections;
    uVar14 = pCVar1->max_total_connections;
  }
  if (uVar12 == 0 && uVar14 == 0) {
    return 0;
  }
  if ((cpool->share != (Curl_share *)0x0) && ((cpool->share->specifier & 0x20) != 0)) {
    Curl_share_lock(cpool->idata,CURL_LOCK_DATA_CONNECT,CURL_LOCK_ACCESS_SINGLE);
  }
  cpool->field_0x68 = cpool->field_0x68 | 1;
  if (uVar12 == 0) {
    if (uVar14 == 0) {
      uVar13 = 0;
      goto LAB_001197af;
    }
  }
  else {
    list = cpool_find_bundle(cpool,conn);
    if (list == (cpool_bundle *)0x0) {
      local_68 = 0;
    }
    else {
      local_68 = Curl_llist_count(&list->conns);
    }
    sVar7 = Curl_cshutdn_dest_count(data,conn->destination);
    while (uVar12 <= local_68 + sVar7) {
      if (sVar7 == 0) {
        if (list == (cpool_bundle *)0x0) {
          sVar7 = 0;
          break;
        }
        cVar16 = Curl_now();
        n = Curl_llist_head(&list->conns);
        pcVar10 = (connectdata *)0x0;
        lVar11 = -1;
        for (; n != (Curl_llist_node *)0x0; n = Curl_node_next(n)) {
          pcVar8 = (connectdata *)Curl_node_elem(n);
          _Var6 = Curl_uint_spbset_empty(&pcVar8->xfers_attached);
          if ((_Var6) &&
             (uVar4 = (pcVar8->lastused).tv_sec, uVar5 = (pcVar8->lastused).tv_usec,
             older.tv_usec = uVar5, older.tv_sec = uVar4, newer._12_4_ = 0,
             newer.tv_sec = SUB128(cVar16._0_12_,0), newer.tv_usec = SUB124(cVar16._0_12_,8),
             older._12_4_ = 0, tVar9 = Curl_timediff(newer,older), lVar11 < tVar9)) {
            lVar11 = tVar9;
            pcVar10 = pcVar8;
          }
        }
        if (pcVar10 == (connectdata *)0x0) {
          sVar7 = 0;
          break;
        }
        if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
            ((pcVar3 = (data->state).feat, pcVar3 == (curl_trc_feat *)0x0 || (0 < pcVar3->log_level)
             ))) && (0 < Curl_trc_feat_multi.log_level)) {
          cVar2 = pcVar10->connection_id;
          sVar7 = Curl_llist_count(&list->conns);
          Curl_trc_multi(data,
                         "Discarding connection #%ld from %zu to reach destination limit of %zu",
                         cVar2,sVar7,uVar12);
        }
        Curl_conn_terminate(cpool->idata,pcVar10,false);
        list = cpool_find_bundle(cpool,conn);
        if (list == (cpool_bundle *)0x0) {
          list = (cpool_bundle *)0x0;
          local_68 = 0;
        }
        else {
          local_68 = Curl_llist_count(&list->conns);
        }
      }
      else {
        _Var6 = Curl_cshutdn_close_oldest(data,conn->destination);
        if (!_Var6) break;
      }
      sVar7 = Curl_cshutdn_dest_count(cpool->idata,conn->destination);
    }
    bVar15 = uVar12 <= local_68 + sVar7;
    uVar13 = (uint)bVar15;
    if ((bVar15) || (uVar14 == 0)) goto LAB_001197af;
  }
  sVar7 = Curl_cshutdn_count(cpool->idata);
  while (uVar14 <= cpool->num_conn + sVar7) {
    if (sVar7 == 0) {
      pcVar10 = cpool_get_oldest_idle(cpool);
      if (pcVar10 == (connectdata *)0x0) break;
      if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
          ((pcVar3 = (data->state).feat, pcVar3 == (curl_trc_feat *)0x0 || (0 < pcVar3->log_level)))
          ) && (0 < Curl_trc_feat_multi.log_level)) {
        Curl_trc_multi(data,"Discarding connection #%ld from %zu to reach total limit of %zu",
                       pcVar10->connection_id,cpool->num_conn,uVar14);
      }
      Curl_conn_terminate(cpool->idata,pcVar10,false);
    }
    else {
      _Var6 = Curl_cshutdn_close_oldest(data,(char *)0x0);
      if (!_Var6) break;
    }
    sVar7 = Curl_cshutdn_count(cpool->idata);
  }
  uVar13 = (uint)(uVar14 <= sVar7 + cpool->num_conn) * 2;
LAB_001197af:
  cpool->field_0x68 = cpool->field_0x68 & 0xfe;
  if ((cpool->share != (Curl_share *)0x0) && ((cpool->share->specifier & 0x20) != 0)) {
    Curl_share_unlock(cpool->idata,CURL_LOCK_DATA_CONNECT);
  }
  return uVar13;
}

Assistant:

int Curl_cpool_check_limits(struct Curl_easy *data,
                            struct connectdata *conn)
{
  struct cpool *cpool = cpool_get_instance(data);
  struct cpool_bundle *bundle;
  size_t dest_limit = 0;
  size_t total_limit = 0;
  size_t shutdowns;
  int result = CPOOL_LIMIT_OK;

  if(!cpool)
    return CPOOL_LIMIT_OK;

  if(cpool->idata->multi) {
    dest_limit = cpool->idata->multi->max_host_connections;
    total_limit = cpool->idata->multi->max_total_connections;
  }

  if(!dest_limit && !total_limit)
    return CPOOL_LIMIT_OK;

  CPOOL_LOCK(cpool, cpool->idata);
  if(dest_limit) {
    size_t live;

    bundle = cpool_find_bundle(cpool, conn);
    live = bundle ? Curl_llist_count(&bundle->conns) : 0;
    shutdowns = Curl_cshutdn_dest_count(data, conn->destination);
    while((live  + shutdowns) >= dest_limit) {
      if(shutdowns) {
        /* close one connection in shutdown right away, if we can */
        if(!Curl_cshutdn_close_oldest(data, conn->destination))
          break;
      }
      else if(!bundle)
        break;
      else {
        struct connectdata *oldest_idle = NULL;
        /* The bundle is full. Extract the oldest connection that may
         * be removed now, if there is one. */
        oldest_idle = cpool_bundle_get_oldest_idle(bundle);
        if(!oldest_idle)
          break;
        /* disconnect the old conn and continue */
        CURL_TRC_M(data, "Discarding connection #%"
                     FMT_OFF_T " from %zu to reach destination "
                     "limit of %zu", oldest_idle->connection_id,
                     Curl_llist_count(&bundle->conns), dest_limit);
        Curl_conn_terminate(cpool->idata, oldest_idle, FALSE);

        /* in case the bundle was destroyed in disconnect, look it up again */
        bundle = cpool_find_bundle(cpool, conn);
        live = bundle ? Curl_llist_count(&bundle->conns) : 0;
      }
      shutdowns = Curl_cshutdn_dest_count(cpool->idata, conn->destination);
    }
    if((live + shutdowns) >= dest_limit) {
      result = CPOOL_LIMIT_DEST;
      goto out;
    }
  }

  if(total_limit) {
    shutdowns = Curl_cshutdn_count(cpool->idata);
    while((cpool->num_conn + shutdowns) >= total_limit) {
      if(shutdowns) {
        /* close one connection in shutdown right away, if we can */
        if(!Curl_cshutdn_close_oldest(data, NULL))
          break;
      }
      else {
        struct connectdata *oldest_idle = cpool_get_oldest_idle(cpool);
        if(!oldest_idle)
          break;
        /* disconnect the old conn and continue */
        CURL_TRC_M(data, "Discarding connection #%"
                   FMT_OFF_T " from %zu to reach total "
                   "limit of %zu",
                   oldest_idle->connection_id, cpool->num_conn, total_limit);
        Curl_conn_terminate(cpool->idata, oldest_idle, FALSE);
      }
      shutdowns = Curl_cshutdn_count(cpool->idata);
    }
    if((cpool->num_conn + shutdowns) >= total_limit) {
      result = CPOOL_LIMIT_TOTAL;
      goto out;
    }
  }

out:
  CPOOL_UNLOCK(cpool, cpool->idata);
  return result;
}